

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O3

vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
* NJamSpell::GetDeletes2
            (vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
             *__return_storage_ptr__,wstring *w)

{
  size_type *in_RAX;
  wstring *pwVar1;
  size_type *extraout_RAX;
  undefined8 uVar2;
  ulong uVar3;
  pointer pwVar4;
  undefined1 auStack_e8 [8];
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  currResults;
  undefined1 local_c8 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> nw;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  *local_58;
  undefined1 local_50 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> nw_1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (w->_M_string_length != 0) {
    uVar2 = 0;
    local_58 = __return_storage_ptr__;
    do {
      std::__cxx11::wstring::substr((ulong)local_50,(ulong)w);
      nw.field_2._8_8_ = uVar2 + 1;
      std::__cxx11::wstring::substr((ulong)&local_78,(ulong)w);
      uVar3 = 3;
      if (local_50 != (undefined1  [8])&nw_1._M_string_length) {
        uVar3 = nw_1._M_string_length;
      }
      if (uVar3 < (ulong)(local_70 + (long)nw_1._M_dataplus._M_p)) {
        uVar3 = 3;
        if (local_78 != local_68) {
          uVar3 = local_68[0];
        }
        if (uVar3 < (ulong)(local_70 + (long)nw_1._M_dataplus._M_p)) goto LAB_0014b0d1;
        pwVar1 = (wstring *)
                 std::__cxx11::wstring::replace((ulong)&local_78,0,(wchar_t *)0x0,(ulong)local_50);
      }
      else {
LAB_0014b0d1:
        pwVar1 = (wstring *)std::__cxx11::wstring::_M_append((wchar_t *)local_50,(ulong)local_78);
      }
      std::__cxx11::wstring::wstring((wstring *)local_c8,pwVar1);
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      if (local_50 != (undefined1  [8])&nw_1._M_string_length) {
        operator_delete((void *)local_50);
      }
      if (nw._M_dataplus._M_p != (pointer)0x0) {
        auStack_e8 = (undefined1  [8])0x0;
        currResults.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        currResults.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pwVar4 = (pointer)0x0;
        do {
          std::__cxx11::wstring::substr((ulong)&local_78,(ulong)local_c8);
          pwVar4 = (pointer)((long)pwVar4 + 1);
          std::__cxx11::wstring::substr((ulong)&local_98,(ulong)local_c8);
          uVar3 = 3;
          if (local_78 != local_68) {
            uVar3 = local_68[0];
          }
          if (uVar3 < (ulong)(local_90 + local_70)) {
            uVar3 = 3;
            if (local_98 != local_88) {
              uVar3 = local_88[0];
            }
            if (uVar3 < (ulong)(local_90 + local_70)) goto LAB_0014b1a8;
            pwVar1 = (wstring *)
                     std::__cxx11::wstring::replace
                               ((ulong)&local_98,0,(wchar_t *)0x0,(ulong)local_78);
          }
          else {
LAB_0014b1a8:
            pwVar1 = (wstring *)
                     std::__cxx11::wstring::_M_append((wchar_t *)&local_78,(ulong)local_98);
          }
          std::__cxx11::wstring::wstring((wstring *)local_50,pwVar1);
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
          if (local_78 != local_68) {
            operator_delete(local_78);
          }
          if (nw_1._M_dataplus._M_p != (pointer)0x0) {
            std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)auStack_e8,(value_type *)local_50);
          }
          if (local_50 != (undefined1  [8])&nw_1._M_string_length) {
            operator_delete((void *)local_50);
          }
        } while (pwVar4 < nw._M_dataplus._M_p);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)auStack_e8,(value_type *)local_c8);
        std::
        vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
        ::push_back(local_58,(vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              *)auStack_e8);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)auStack_e8);
      }
      in_RAX = &nw._M_string_length;
      if (local_c8 != (undefined1  [8])in_RAX) {
        operator_delete((void *)local_c8);
        in_RAX = extraout_RAX;
      }
      uVar2 = nw.field_2._8_8_;
    } while ((ulong)nw.field_2._8_8_ < w->_M_string_length);
  }
  return (vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
          *)in_RAX;
}

Assistant:

static std::vector<std::vector<std::wstring>> GetDeletes2(const std::wstring& w) {
    std::vector<std::vector<std::wstring>> results;
    for (size_t i = 0; i < w.size(); ++i) {
        auto nw = w.substr(0, i) + w.substr(i+1);
        if (!nw.empty()) {
            std::vector<std::wstring> currResults = GetDeletes1(nw);
            currResults.push_back(nw);
            results.push_back(currResults);
        }
    }
    return results;
}